

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

uint * getRevealedNodes(tree_t *tree,uint16_t *hideList,size_t hideListSize,size_t *outputSize)

{
  _Bool _Var1;
  uint uVar2;
  void *__ptr;
  uint *list;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  tree_t *in_RDI;
  uint sibling;
  uint node_1;
  size_t i_1;
  uint d;
  uint revealedPos;
  uint *revealed;
  uint pos;
  uint node;
  size_t i;
  uint *pathSets;
  uint pathLen;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  ulong local_58;
  uint local_50;
  uint local_4c;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  uVar2 = in_RDI->depth - 1;
  __ptr = calloc(in_RDX * uVar2,4);
  for (local_38 = 0; local_38 < in_RDX; local_38 = local_38 + 1) {
    local_3c = (uint)*(ushort *)(in_RSI + local_38 * 2) + (in_RDI->numNodes - in_RDI->numLeaves);
    *(uint *)((long)__ptr + local_38 * 4) = local_3c;
    local_40 = 1;
    while (local_3c = getParent(local_3c), local_3c != 0) {
      *(uint *)((long)__ptr + (local_40 * in_RDX + local_38) * 4) = local_3c;
      local_40 = local_40 + 1;
    }
  }
  list = (uint *)malloc((ulong)in_RDI->numLeaves << 2);
  local_4c = 0;
  for (local_50 = 0; local_50 < uVar2; local_50 = local_50 + 1) {
    for (local_58 = 0; local_58 < in_RDX; local_58 = local_58 + 1) {
      uVar3 = *(undefined4 *)((long)__ptr + (local_50 * in_RDX + local_58) * 4);
      _Var1 = hasSibling((tree_t *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff9c);
      if (_Var1) {
        in_stack_ffffffffffffffa0 =
             getSibling((tree_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
        _Var1 = contains((uint *)((long)__ptr + local_50 * in_RDX * 4),in_RDX,
                         in_stack_ffffffffffffffa0);
        if (!_Var1) {
          while( true ) {
            _Var1 = hasRightChild((tree_t *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff9c);
            in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c & 0xffffff;
            if (!_Var1) {
              _Var1 = isLeafNode(in_RDI,in_stack_ffffffffffffffa0);
              in_stack_ffffffffffffff9c =
                   CONCAT13(_Var1,(int3)in_stack_ffffffffffffff9c) ^ 0xff000000;
            }
            if ((in_stack_ffffffffffffff9c & 0x1000000) == 0) break;
            in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 * 2 + 1;
          }
          _Var1 = contains(list,(ulong)local_4c,in_stack_ffffffffffffffa0);
          if (!_Var1) {
            list[local_4c] = in_stack_ffffffffffffffa0;
            local_4c = local_4c + 1;
          }
        }
      }
    }
  }
  free(__ptr);
  *in_RCX = (ulong)local_4c;
  return list;
}

Assistant:

static unsigned int* getRevealedNodes(tree_t* tree, uint16_t* hideList, size_t hideListSize,
                                      size_t* outputSize) {
  /* Compute paths up from hideList to root, store as sets of nodes */
  const unsigned int pathLen = tree->depth - 1;

  /* pathSets[i][0...hideListSize] ~= pathSets[i * hideListSize + ...] stores the nodes in the path
   * at depth i for each of the leaf nodes in hideListSize */
  unsigned int* pathSets = calloc(hideListSize * pathLen, sizeof(unsigned int));

  /* Compute the paths back to the root */
  for (size_t i = 0; i < hideListSize; i++) {
    /* input lists leaf indexes, translate to nodes */
    unsigned int node                    = hideList[i] + (tree->numNodes - tree->numLeaves);
    pathSets[/* 0 * hideListSize + */ i] = node;
    unsigned int pos                     = 1;
    while ((node = getParent(node)) != 0) {
      pathSets[pos * hideListSize + i] = node;
      pos++;
    }
  }

  /* Determine seeds to reveal */
  unsigned int* revealed   = malloc(tree->numLeaves * sizeof(unsigned int));
  unsigned int revealedPos = 0;
  for (unsigned int d = 0; d < pathLen; d++) {
    for (size_t i = 0; i < hideListSize; i++) {
      unsigned int node = pathSets[d * hideListSize + i];
      if (!hasSibling(tree, node)) {
        continue;
      }
      unsigned int sibling = getSibling(tree, node);
      if (!contains(&pathSets[d * hideListSize], hideListSize, sibling)) {
        // Determine the seed to reveal
        while (!hasRightChild(tree, sibling) && !isLeafNode(tree, sibling)) {
          sibling = 2 * sibling + 1; // sibling = leftChild(sibling)
        }
        // Only reveal if we haven't already
        if (!contains(revealed, revealedPos, sibling)) {
          revealed[revealedPos] = sibling;
          revealedPos++;
        }
      }
    }
  }

  free(pathSets);

  *outputSize = revealedPos;
  return revealed;
}